

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O1

opj_bool t2_read_packet_header
                   (opj_t2_v2_t *p_t2,opj_tcd_tile_v2_t *p_tile,opj_tcp_v2_t *p_tcp,
                   opj_pi_iterator_t *p_pi,opj_bool *p_is_data_present,OPJ_BYTE *p_src_data,
                   OPJ_UINT32 *p_data_read,OPJ_UINT32 p_max_length,opj_packet_info_t *p_pack_info)

{
  opj_cp_v2_t *poVar1;
  opj_tcd_resolution_v2_t *poVar2;
  opj_tcd_precinct_v2_t *poVar3;
  opj_tcd_seg_t *poVar4;
  int iVar5;
  int iVar6;
  OPJ_UINT32 OVar7;
  int iVar8;
  uint uVar9;
  opj_bool oVar10;
  int iVar11;
  opj_bio_t *bio;
  OPJ_UINT32 *pOVar12;
  ulong uVar13;
  opj_tcd_band_v2_t *poVar14;
  OPJ_BYTE *pOVar15;
  opj_tcd_cblk_dec_v2_t *cblk;
  uchar *puVar16;
  uint uVar17;
  ulong uVar18;
  OPJ_UINT32 leafno;
  OPJ_UINT32 i;
  uint uVar19;
  OPJ_BYTE *l_current_data;
  OPJ_UINT32 l_remaining_length;
  int local_98;
  OPJ_BYTE **local_78;
  uchar *local_68;
  OPJ_UINT32 *local_60;
  opj_tcd_band_v2_t *local_58;
  OPJ_UINT32 local_4c;
  opj_bool *local_48;
  uchar *local_40;
  OPJ_UINT32 local_34;
  
  poVar1 = p_t2->cp;
  iVar11 = p_pi->resno;
  poVar2 = p_tile->comps[p_pi->compno].resolutions;
  local_68 = p_src_data;
  local_48 = p_is_data_present;
  if ((p_pi->layno == 0) && (poVar2[iVar11].numbands != 0)) {
    poVar14 = poVar2[iVar11].bands;
    uVar17 = 0;
    do {
      if ((poVar14->x1 != poVar14->x0) && (poVar14->y1 != poVar14->y0)) {
        iVar6 = p_pi->precno;
        poVar3 = poVar14->precincts;
        tgt_reset(poVar3[iVar6].incltree);
        tgt_reset(poVar3[iVar6].imsbtree);
        iVar5 = poVar3[iVar6].ch * poVar3[iVar6].cw;
        if (iVar5 != 0) {
          pOVar12 = &(poVar3[iVar6].cblks.enc)->numpassesinlayers;
          do {
            *(undefined8 *)(pOVar12 + -1) = 0;
            pOVar12 = pOVar12 + 0x10;
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
        }
      }
      poVar14 = poVar14 + 1;
      uVar17 = uVar17 + 1;
    } while (uVar17 < poVar2[iVar11].numbands);
  }
  if ((((p_tcp->csty & 2) != 0) && (*p_src_data == 0xff)) && (p_src_data[1] == 0x91)) {
    local_68 = p_src_data + 6;
  }
  bio = bio_create();
  oVar10 = 0;
  if (bio != (opj_bio_t *)0x0) {
    local_98 = (int)p_src_data;
    if ((poVar1->field_0x88 & 1) == 0) {
      if ((p_tcp->field_0x1628 & 1) == 0) {
        local_78 = &local_68;
        local_60 = &local_34;
        local_34 = (p_max_length + local_98) - (int)local_68;
        pOVar15 = local_68;
      }
      else {
        local_78 = &p_tcp->ppt_data;
        pOVar15 = p_tcp->ppt_data;
        local_60 = &p_tcp->ppt_len;
      }
    }
    else {
      local_78 = &poVar1->ppm_data;
      pOVar15 = poVar1->ppm_data;
      local_60 = &poVar1->ppm_len;
    }
    bio_init_dec(bio,pOVar15,*local_60);
    iVar6 = bio_read(bio,1);
    if (iVar6 == 0) {
      bio_inalign(bio);
      iVar11 = bio_numbytes(bio);
      puVar16 = pOVar15 + iVar11;
      bio_destroy(bio);
      if ((p_tcp->csty & 4) != 0) {
        if ((*puVar16 == 0xff) && (puVar16[1] == 0x92)) {
          puVar16 = puVar16 + 2;
        }
        else {
          puts("Error : expected EPH marker");
        }
      }
      pOVar15 = *local_78;
      uVar17 = (int)puVar16 - (int)pOVar15;
      *local_60 = *local_60 - uVar17;
      *local_78 = pOVar15 + uVar17;
      *local_48 = 0;
      *p_data_read = (int)local_68 - local_98;
    }
    else {
      local_40 = pOVar15;
      if (poVar2[iVar11].numbands != 0) {
        poVar14 = poVar2[iVar11].bands;
        uVar17 = 0;
        do {
          if ((poVar14->x1 == poVar14->x0) || (poVar14->y1 == poVar14->y0)) {
            iVar6 = 10;
            poVar14 = poVar14 + 1;
          }
          else {
            iVar5 = p_pi->precno;
            poVar3 = poVar14->precincts;
            local_4c = poVar3[iVar5].ch * poVar3[iVar5].cw;
            local_58 = poVar14;
            if (local_4c != 0) {
              cblk = poVar3[iVar5].cblks.dec;
              leafno = 0;
              do {
                if (cblk->numsegs == 0) {
                  OVar7 = tgt_decode(bio,poVar3[iVar5].incltree,leafno,p_pi->layno + 1);
                }
                else {
                  OVar7 = bio_read(bio,1);
                }
                if (OVar7 == 0) {
                  cblk->numnewpasses = 0;
                  cblk = cblk + 1;
                  iVar6 = 0xd;
                }
                else {
                  if (cblk->numsegs == 0) {
                    iVar6 = 0;
                    do {
                      OVar7 = tgt_decode(bio,poVar3[iVar5].imsbtree,leafno,iVar6);
                      iVar6 = iVar6 + 1;
                    } while (OVar7 == 0);
                    cblk->numbps = (local_58->numbps - iVar6) + 2;
                    cblk->numlenbits = 3;
                  }
                  OVar7 = t2_getnumpasses(bio);
                  cblk->numnewpasses = OVar7;
                  iVar6 = -1;
                  do {
                    iVar8 = bio_read(bio,1);
                    iVar6 = iVar6 + 1;
                  } while (iVar8 != 0);
                  cblk->numlenbits = cblk->numlenbits + iVar6;
                  uVar19 = cblk->numsegs;
                  if (uVar19 == 0) {
                    uVar18 = 0;
                    iVar6 = t2_init_seg_v2(cblk,0,p_tcp->tccps[p_pi->compno].cblksty,1);
LAB_0013f3fb:
                    if (iVar6 == 0) {
LAB_0013f4a1:
                      bio_destroy(bio);
                      iVar6 = 1;
                      goto LAB_0013f4b3;
                    }
                  }
                  else {
                    uVar18 = (ulong)(uVar19 - 1);
                    if (cblk->segs[uVar18].numpasses == cblk->segs[uVar18].maxpasses) {
                      iVar6 = t2_init_seg_v2(cblk,uVar19,p_tcp->tccps[p_pi->compno].cblksty,0);
                      uVar18 = (ulong)uVar19;
                      goto LAB_0013f3fb;
                    }
                  }
                  uVar19 = cblk->numnewpasses;
                  do {
                    poVar4 = cblk->segs;
                    uVar9 = poVar4[uVar18].maxpasses - poVar4[uVar18].numpasses;
                    if ((int)uVar19 <= (int)uVar9) {
                      uVar9 = uVar19;
                    }
                    poVar4[uVar18].numnewpasses = uVar9;
                    iVar6 = 0;
                    if (1 < uVar9) {
                      iVar6 = 0;
                      uVar13 = (ulong)uVar9;
                      do {
                        iVar6 = iVar6 + 1;
                        uVar9 = (uint)uVar13;
                        uVar13 = uVar13 >> 1;
                      } while (3 < uVar9);
                    }
                    OVar7 = bio_read(bio,iVar6 + cblk->numlenbits);
                    poVar4 = cblk->segs;
                    poVar4[uVar18].newlen = OVar7;
                    uVar19 = uVar19 - poVar4[uVar18].numnewpasses;
                    if (0 < (int)uVar19) {
                      uVar9 = (int)uVar18 + 1;
                      uVar18 = (ulong)uVar9;
                      oVar10 = t2_init_seg_v2(cblk,uVar9,p_tcp->tccps[p_pi->compno].cblksty,0);
                      if (oVar10 == 0) goto LAB_0013f4a1;
                    }
                  } while (0 < (int)uVar19);
                  cblk = cblk + 1;
                  iVar6 = 0;
                }
LAB_0013f4b3:
                if ((iVar6 != 0xd) && (poVar14 = local_58, iVar6 != 0)) goto LAB_0013f4e0;
                leafno = leafno + 1;
              } while (leafno != local_4c);
            }
            iVar6 = 0;
            poVar14 = local_58 + 1;
          }
LAB_0013f4e0:
          if ((iVar6 != 10) && (iVar6 != 0)) {
            return 0;
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 < poVar2[iVar11].numbands);
      }
      iVar11 = bio_inalign(bio);
      if (iVar11 != 0) {
        bio_destroy(bio);
        return 0;
      }
      iVar11 = bio_numbytes(bio);
      puVar16 = local_40 + iVar11;
      bio_destroy(bio);
      if (((p_tcp->csty & 4) != 0) && (*puVar16 == 0xff)) {
        puVar16 = puVar16 + (ulong)(puVar16[1] == 0x92) * 2;
      }
      pOVar15 = *local_78;
      uVar17 = (int)puVar16 - (int)pOVar15;
      *local_60 = *local_60 - uVar17;
      *local_78 = pOVar15 + uVar17;
      *local_48 = 1;
      *p_data_read = (int)local_68 - local_98;
    }
    oVar10 = 1;
  }
  return oVar10;
}

Assistant:

static opj_bool t2_read_packet_header(
							 opj_t2_v2_t* p_t2,
							 opj_tcd_tile_v2_t *p_tile,
                             opj_tcp_v2_t *p_tcp,
							 opj_pi_iterator_t *p_pi,
							 opj_bool * p_is_data_present,
							 OPJ_BYTE *p_src_data,
							 OPJ_UINT32 * p_data_read,
							 OPJ_UINT32 p_max_length,
							 opj_packet_info_t *p_pack_info)
{
	/* loop */
	OPJ_UINT32 bandno, cblkno;
	OPJ_UINT32 l_nb_code_blocks;
	OPJ_UINT32 l_remaining_length;
	OPJ_UINT32 l_header_length;
	OPJ_UINT32 * l_modified_length_ptr = 00;
	OPJ_BYTE *l_current_data = p_src_data;
	opj_cp_v2_t *l_cp = p_t2->cp;
	opj_bio_t *l_bio = 00;	/* BIO component */
	opj_tcd_band_v2_t *l_band = 00;
	opj_tcd_cblk_dec_v2_t* l_cblk = 00;
	opj_tcd_resolution_v2_t* l_res = &p_tile->comps[p_pi->compno].resolutions[p_pi->resno];

	OPJ_BYTE *l_header_data = 00;
	OPJ_BYTE **l_header_data_start = 00;

	OPJ_UINT32 l_present;

	if (p_pi->layno == 0) {
		l_band = l_res->bands;

		/* reset tagtrees */
		for (bandno = 0; bandno < l_res->numbands; ++bandno) {
			opj_tcd_precinct_v2_t *l_prc = &l_band->precincts[p_pi->precno];

			if ( ! ((l_band->x1-l_band->x0 == 0)||(l_band->y1-l_band->y0 == 0)) ) {
				tgt_reset(l_prc->incltree);
				tgt_reset(l_prc->imsbtree);
				l_cblk = l_prc->cblks.dec;

				l_nb_code_blocks = l_prc->cw * l_prc->ch;
				for (cblkno = 0; cblkno < l_nb_code_blocks; ++cblkno) {
					l_cblk->numsegs = 0;
					l_cblk->real_num_segs = 0;
					++l_cblk;
				}
			}

			++l_band;
		}
	}

	/* SOP markers */

	if (p_tcp->csty & J2K_CP_CSTY_SOP) {
		if ((*l_current_data) != 0xff || (*(l_current_data + 1) != 0x91)) {
			/* TODO opj_event_msg(t2->cinfo->event_mgr, EVT_WARNING, "Expected SOP marker\n"); */
		} else {
			l_current_data += 6;
		}

		/** TODO : check the Nsop value */
	}

	/*
	When the marker PPT/PPM is used the packet header are store in PPT/PPM marker
	This part deal with this caracteristic
	step 1: Read packet header in the saved structure
	step 2: Return to codestream for decoding
	*/

	l_bio = bio_create();
	if (! l_bio) {
		return OPJ_FALSE;
	}

	if (l_cp->ppm == 1) { /* PPM */
		l_header_data_start = &l_cp->ppm_data;
		l_header_data = *l_header_data_start;
		l_modified_length_ptr = &(l_cp->ppm_len);

	}
	else if (p_tcp->ppt == 1) { /* PPT */
		l_header_data_start = &(p_tcp->ppt_data);
		l_header_data = *l_header_data_start;
		l_modified_length_ptr = &(p_tcp->ppt_len);
	}
	else {	/* Normal Case */
		l_header_data_start = &(l_current_data);
		l_header_data = *l_header_data_start;
		l_remaining_length = p_src_data+p_max_length-l_header_data;
		l_modified_length_ptr = &(l_remaining_length);
	}

	bio_init_dec(l_bio, l_header_data,*l_modified_length_ptr);

	l_present = bio_read(l_bio, 1);
	if (!l_present) {
		bio_inalign(l_bio);
		l_header_data += bio_numbytes(l_bio);
		bio_destroy(l_bio);

		/* EPH markers */
		if (p_tcp->csty & J2K_CP_CSTY_EPH) {
			if ((*l_header_data) != 0xff || (*(l_header_data + 1) != 0x92)) {
				printf("Error : expected EPH marker\n");
			} else {
				l_header_data += 2;
			}
		}

		l_header_length = (l_header_data - *l_header_data_start);
		*l_modified_length_ptr -= l_header_length;
		*l_header_data_start += l_header_length;

		/* << INDEX */
		/* End of packet header position. Currently only represents the distance to start of packet
		   Will be updated later by incrementing with packet start value */
		if (p_pack_info) {
			p_pack_info->end_ph_pos = (OPJ_INT32)(l_current_data - p_src_data);
		}
		/* INDEX >> */

		* p_is_data_present = OPJ_FALSE;
		*p_data_read = l_current_data - p_src_data;
		return OPJ_TRUE;
	}

	l_band = l_res->bands;
	for (bandno = 0; bandno < l_res->numbands; ++bandno) {
		opj_tcd_precinct_v2_t *l_prc = &(l_band->precincts[p_pi->precno]);

		if ((l_band->x1-l_band->x0 == 0)||(l_band->y1-l_band->y0 == 0)) {
			++l_band;
			continue;
		}

		l_nb_code_blocks = l_prc->cw * l_prc->ch;
		l_cblk = l_prc->cblks.dec;
		for (cblkno = 0; cblkno < l_nb_code_blocks; cblkno++) {
			OPJ_UINT32 l_included,l_increment, l_segno;
			OPJ_INT32 n;

			/* if cblk not yet included before --> inclusion tagtree */
			if (!l_cblk->numsegs) {
				l_included = tgt_decode(l_bio, l_prc->incltree, cblkno, p_pi->layno + 1);
				/* else one bit */
			}
			else {
				l_included = bio_read(l_bio, 1);
			}

			/* if cblk not included */
			if (!l_included) {
				l_cblk->numnewpasses = 0;
				++l_cblk;
				continue;
			}

			/* if cblk not yet included --> zero-bitplane tagtree */
			if (!l_cblk->numsegs) {
				OPJ_UINT32 i = 0;

				while (!tgt_decode(l_bio, l_prc->imsbtree, cblkno, i)) {
					++i;
				}

				l_cblk->numbps = l_band->numbps + 1 - i;
				l_cblk->numlenbits = 3;
			}

			/* number of coding passes */
			l_cblk->numnewpasses = t2_getnumpasses(l_bio);
			l_increment = t2_getcommacode(l_bio);

			/* length indicator increment */
			l_cblk->numlenbits += l_increment;
			l_segno = 0;

			if (!l_cblk->numsegs) {
				if (! t2_init_seg_v2(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 1)) {
					bio_destroy(l_bio);
					return OPJ_FALSE;
				}
			}
			else {
				l_segno = l_cblk->numsegs - 1;
				if (l_cblk->segs[l_segno].numpasses == l_cblk->segs[l_segno].maxpasses) {
					++l_segno;
					if (! t2_init_seg_v2(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 0)) {
						bio_destroy(l_bio);
						return OPJ_FALSE;
					}
				}
			}
			n = l_cblk->numnewpasses;

			do {
				l_cblk->segs[l_segno].numnewpasses = int_min(l_cblk->segs[l_segno].maxpasses - l_cblk->segs[l_segno].numpasses, n);
				l_cblk->segs[l_segno].newlen = bio_read(l_bio, l_cblk->numlenbits + uint_floorlog2(l_cblk->segs[l_segno].numnewpasses));

				n -= l_cblk->segs[l_segno].numnewpasses;
				if (n > 0) {
					++l_segno;

					if (! t2_init_seg_v2(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 0)) {
						bio_destroy(l_bio);
						return OPJ_FALSE;
					}
				}
			} while (n > 0);

			++l_cblk;
		}

		++l_band;
	}

	if (bio_inalign(l_bio)) {
		bio_destroy(l_bio);
		return OPJ_FALSE;
	}

	l_header_data += bio_numbytes(l_bio);
	bio_destroy(l_bio);

	/* EPH markers */
	if (p_tcp->csty & J2K_CP_CSTY_EPH) {
		if ((*l_header_data) != 0xff || (*(l_header_data + 1) != 0x92)) {
			/* TODO opj_event_msg(t2->cinfo->event_mgr, EVT_ERROR, "Expected EPH marker\n"); */
		} else {
			l_header_data += 2;
		}
	}

	l_header_length = (l_header_data - *l_header_data_start);
	*l_modified_length_ptr -= l_header_length;
	*l_header_data_start += l_header_length;

	/* << INDEX */
	/* End of packet header position. Currently only represents the distance to start of packet
	 Will be updated later by incrementing with packet start value */
	if (p_pack_info) {
		p_pack_info->end_ph_pos = (OPJ_INT32)(l_current_data - p_src_data);
	}
	/* INDEX >> */

	*p_is_data_present = OPJ_TRUE;
	*p_data_read = l_current_data - p_src_data;

	return OPJ_TRUE;
}